

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qps.h
# Opt level: O2

void __thiscall qps::~qps(qps *this)

{
  this->stop_ = true;
  std::thread::join();
  std::thread::~thread(&this->thd_);
  return;
}

Assistant:

~qps() {
    stop_ = true;
    thd_.join();
  }